

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void finish(stagewise_poly *poly)

{
  uchar *__ptr;
  
  features::delete_v((poly->synth_ec).super_example_predict.feature_space + 0x86);
  __ptr = (poly->synth_ec).super_example_predict.indices._begin;
  if (__ptr != (uchar *)0x0) {
    free(__ptr);
  }
  (poly->synth_ec).super_example_predict.indices._begin = (uchar *)0x0;
  (poly->synth_ec).super_example_predict.indices._end = (uchar *)0x0;
  (poly->synth_ec).super_example_predict.indices.end_array = (uchar *)0x0;
  free(poly->sd);
  free(poly->depthsbits);
  return;
}

Assistant:

void finish(stagewise_poly &poly)
{
#ifdef DEBUG
  cout << "total feature number (after poly expansion!) = " << poly.sum_sparsity << endl;
#endif  // DEBUG

  poly.synth_ec.feature_space[tree_atomics].delete_v();
  poly.synth_ec.indices.delete_v();
  sort_data_destroy(poly);
  depthsbits_destroy(poly);
}